

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O0

type __thiscall
asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
          (basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *this,
          string *host,string *service,anon_class_8_1_8991fb9c *handler)

{
  anon_class_8_1_8991fb9c *in_stack_00000070;
  flags in_stack_0000007c;
  string *in_stack_00000080;
  string *in_stack_00000088;
  basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *in_stack_00000090;
  
  async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007c,
             in_stack_00000070);
  return;
}

Assistant:

async_resolve(const std::string& host, const std::string& service,
      ASIO_MOVE_ARG(ResolveHandler) handler)
  {
    return async_resolve(host, service, resolver_base::flags(),
        ASIO_MOVE_CAST(ResolveHandler)(handler));
  }